

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O3

bool __thiscall
miniros::master::ParameterStorage::deleteParam(ParameterStorage *this,string *caller_id,string *key)

{
  int iVar1;
  long *plVar2;
  size_type *psVar3;
  XmlRpcValue *this_00;
  bool bVar4;
  bool bVar5;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar6;
  string fullKey;
  Path path;
  string local_c0;
  string local_a0;
  undefined1 local_80 [80];
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (deleteParam::loc.initialized_ == false) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"miniros.unknown_package","");
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_a0);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_c0.field_2._M_allocated_capacity = *psVar3;
      local_c0.field_2._8_8_ = plVar2[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar3;
      local_c0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_c0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_c0);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      local_80._16_8_ = *psVar3;
      local_80._24_8_ = plVar2[3];
      local_80._0_8_ = local_80 + 0x10;
    }
    else {
      local_80._16_8_ = *psVar3;
      local_80._0_8_ = (size_type *)*plVar2;
    }
    local_80._8_8_ = *(anon_union_8_8_d5adaace_for__value *)(plVar2 + 1);
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    console::initializeLogLocation(&deleteParam::loc,(string *)local_80,Info);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (deleteParam::loc.level_ != Info) {
    deleteParam();
  }
  if (deleteParam::loc.logger_enabled_ == true) {
    deleteParam();
  }
  names::resolve(&local_c0,caller_id,key,false);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_parameterLock);
  if (iVar1 == 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_c0);
    if (iVar1 == 0) {
      XmlRpc::XmlRpcValue::Dict();
      XmlRpc::XmlRpcValue::operator=(&this->m_parameterRoot,(XmlRpcValue *)local_80);
      XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)local_80);
      bVar4 = true;
      checkParamUpdates(this,&local_c0,(RpcValue *)0x0);
    }
    else {
      names::Path::Path((Path *)local_80);
      names::Path::fromString((Path *)local_80,&local_c0);
      pVar6 = findParameter(this,(Path *)local_80,false);
      this_00 = pVar6.second;
      bVar5 = pVar6.first != (XmlRpcValue *)0x0;
      bVar4 = this_00 != (XmlRpcValue *)0x0 && bVar5;
      if (this_00 != (XmlRpcValue *)0x0 && bVar5) {
        names::Path::name_abi_cxx11_(&local_a0,(Path *)local_80);
        XmlRpc::XmlRpcValue::eraseMember(this_00,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        checkParamUpdates(this,&local_c0,(RpcValue *)0x0);
      }
      names::Path::~Path((Path *)local_80);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return bVar4;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool ParameterStorage::deleteParam(const std::string& caller_id, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "deleteParam %s from %s", key.c_str(), caller_id.c_str());
  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  std::scoped_lock<std::mutex> m_lock(m_parameterLock);
  if (fullKey == "/") {
    m_parameterRoot = RpcValue::Dict();
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  names::Path path;
  path.fromString(fullKey);

  auto p = findParameter(path, false);
  if (p.first && p.second) {
    p.second->eraseMember(path.name());
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  return false;
}